

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O0

double __thiscall
HSimplexNla::debugInvertResidualError
          (HSimplexNla *this,bool transposed,HVector *solution,HVector *residual)

{
  double dVar1;
  double dVar2;
  int iVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  long *in_RDI;
  double residual_error;
  HighsInt iRow_2;
  double residual_error_norm;
  HighsInt index_3;
  HighsInt index_2;
  HighsInt iEl_1;
  HighsInt iCol_1;
  double value_2;
  HighsInt iRow_1;
  double value_1;
  HighsInt index_1;
  double value;
  HighsInt index;
  HighsInt iEl;
  HighsInt iCol;
  HighsInt iRow;
  HighsInt *basic_index;
  vector<double,_std::allocator<double>_> *a_matrix_value;
  vector<int,_std::allocator<int>_> *a_matrix_index;
  vector<int,_std::allocator<int>_> *a_matrix_start;
  HighsInt num_col;
  HighsInt num_row;
  value_type local_a8;
  int local_9c;
  double local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double local_80;
  int local_74;
  double local_70;
  int local_64;
  double local_60;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  vector<double,_std::allocator<double>_> *local_40;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *local_30;
  int local_28;
  int local_24;
  long local_20;
  long local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_24 = *(int *)(*in_RDI + 4);
  local_28 = *(int *)*in_RDI;
  local_30 = (vector<int,_std::allocator<int>_> *)(*in_RDI + 0x90);
  local_38 = (vector<int,_std::allocator<int>_> *)(*in_RDI + 0xc0);
  local_40 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0xd8);
  local_48 = in_RDI[2];
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (local_9 == 0) {
    for (local_74 = 0; local_74 < local_24; local_74 = local_74 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                          (long)local_74);
      dVar1 = *pvVar5;
      local_84 = *(int *)(local_48 + (long)local_74 * 4);
      local_80 = dVar1;
      if (local_84 < local_28) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_84);
        for (local_88 = *pvVar4; iVar3 = local_88,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_30,(long)(local_84 + 1)), iVar3 < *pvVar4;
            local_88 = local_88 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_88);
          dVar2 = local_80;
          local_8c = *pvVar4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_88)
          ;
          dVar1 = *pvVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)local_8c);
          *pvVar6 = -dVar2 * dVar1 + *pvVar6;
        }
      }
      else {
        local_90 = local_84 - local_28;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                            (long)local_90);
        *pvVar6 = *pvVar6 - dVar1;
      }
    }
  }
  else {
    for (local_4c = 0; local_4c < local_24; local_4c = local_4c + 1) {
      local_50 = *(int *)(local_48 + (long)local_4c * 4);
      if (local_50 < local_28) {
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_50);
        for (local_54 = *pvVar4; iVar3 = local_54,
            pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                               (local_30,(long)(local_50 + 1)), iVar3 < *pvVar4;
            local_54 = local_54 + 1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)local_54);
          local_58 = *pvVar4;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                              (long)local_58);
          dVar1 = *pvVar5;
          local_60 = dVar1;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_40,(long)local_54)
          ;
          dVar2 = *pvVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                              (long)local_4c);
          *pvVar6 = -dVar1 * dVar2 + *pvVar6;
        }
      }
      else {
        local_64 = local_50 - local_28;
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                            (long)local_64);
        dVar1 = *pvVar5;
        local_70 = dVar1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),
                            (long)local_4c);
        *pvVar6 = *pvVar6 - dVar1;
      }
    }
  }
  local_98 = 0.0;
  for (local_9c = 0; local_9c < local_24; local_9c = local_9c + 1) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_20 + 0x20),(long)local_9c)
    ;
    local_a8 = ABS(*pvVar6);
    pdVar7 = std::max<double>(&local_a8,&local_98);
    local_98 = *pdVar7;
  }
  return local_98;
}

Assistant:

double HSimplexNla::debugInvertResidualError(const bool transposed,
                                             const HVector& solution,
                                             HVector& residual) const {
  const HighsInt num_row = this->lp_->num_row_;
  const HighsInt num_col = this->lp_->num_col_;
  const vector<HighsInt>& a_matrix_start = this->lp_->a_matrix_.start_;
  const vector<HighsInt>& a_matrix_index = this->lp_->a_matrix_.index_;
  const vector<double>& a_matrix_value = this->lp_->a_matrix_.value_;
  const HighsInt* basic_index = this->basic_index_;

  if (transposed) {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          double value = solution.array[index];
          residual.array[iRow] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        double value = solution.array[index];
        residual.array[iRow] -= value;
      }
    }
  } else {
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      double value = solution.array[iRow];
      HighsInt iCol = basic_index[iRow];
      if (iCol < num_col) {
        for (HighsInt iEl = a_matrix_start[iCol];
             iEl < a_matrix_start[iCol + 1]; iEl++) {
          HighsInt index = a_matrix_index[iEl];
          residual.array[index] -= value * a_matrix_value[iEl];
        }
      } else {
        HighsInt index = iCol - num_col;
        residual.array[index] -= value;
      }
    }
  }

  double residual_error_norm = 0;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    double residual_error = fabs(residual.array[iRow]);
    residual_error_norm = std::max(residual_error, residual_error_norm);
  }
  return residual_error_norm;
}